

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_PlayerStartStomp(AActor *actor,bool mononly)

{
  FPortalGroupArray *this;
  AActor *target;
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  TAngle<double> local_240;
  FName local_238;
  TFlags<ActorFlag3,_unsigned_int> local_234;
  double local_230;
  double blockdist;
  AActor *local_220;
  AActor *th;
  CheckResult cres;
  undefined1 local_1e0 [8];
  FMultiBlockThingsIterator mit;
  FPortalGroupArray grouplist;
  bool mononly_local;
  AActor *actor_local;
  
  this = (FPortalGroupArray *)(mit.bbox.m_Box + 3);
  FPortalGroupArray::FPortalGroupArray(this,1);
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            ((FMultiBlockThingsIterator *)local_1e0,this,actor,-1.0,false);
  FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&th);
  while (bVar1 = FMultiBlockThingsIterator::Next
                           ((FMultiBlockThingsIterator *)local_1e0,(CheckResult *)&th), bVar1) {
    local_220 = th;
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&blockdist + 4),
               (int)th + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&blockdist + 4));
    if (((uVar2 != 0) && (local_220 != actor)) &&
       ((local_220->player != actor->player || (local_220->player == (player_t *)0x0)))) {
      local_230 = local_220->radius + actor->radius;
      dVar3 = AActor::X(local_220);
      if ((ABS(dVar3 - (double)cres.thing) < local_230) &&
         (dVar3 = AActor::Y(local_220), ABS(dVar3 - cres.Position.X) < local_230)) {
        bVar1 = false;
        if (local_220->player == (player_t *)0x0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_234,
                     (int)local_220 +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_234);
          bVar1 = uVar2 == 0;
        }
        if ((!bVar1) && ((local_220->player == (player_t *)0x0 || (!mononly)))) {
          dVar3 = AActor::Z(actor);
          dVar4 = AActor::Top(local_220);
          if (dVar3 <= dVar4) {
            dVar3 = AActor::Top(actor);
            dVar4 = AActor::Z(local_220);
            target = local_220;
            if (dVar4 <= dVar3) {
              FName::FName(&local_238,NAME_Telefrag);
              TAngle<double>::TAngle(&local_240,0.0);
              P_DamageMobj(target,actor,actor,1000000,&local_238,0,&local_240);
            }
          }
        }
      }
    }
  }
  FMultiBlockThingsIterator::~FMultiBlockThingsIterator((FMultiBlockThingsIterator *)local_1e0);
  FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(mit.bbox.m_Box + 3));
  return;
}

Assistant:

void P_PlayerStartStomp(AActor *actor, bool mononly)
{
	FPortalGroupArray grouplist;
	FMultiBlockThingsIterator mit(grouplist, actor);
	FMultiBlockThingsIterator::CheckResult cres;

	while ((mit.Next(&cres)))
	{
		AActor *th = cres.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self, and don't kill your own voodoo dolls
		if (th == actor || (th->player == actor->player && th->player != NULL))
			continue;

		double blockdist = th->radius + actor->radius;
		if (fabs(th->X() - cres.Position.X) >= blockdist || fabs(th->Y() - cres.Position.Y) >= blockdist)
			continue;

		// only kill monsters and other players
		if (th->player == NULL && !(th->flags3 & MF3_ISMONSTER))
			continue;

		if (th->player != NULL && mononly)
			continue;

		if (actor->Z() > th->Top())
			continue;        // overhead
		if (actor->Top() < th->Z())
			continue;        // underneath

		P_DamageMobj(th, actor, actor, TELEFRAG_DAMAGE, NAME_Telefrag);
	}
}